

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O3

void __thiscall MdlOptions::MdlOptions(MdlOptions *this,int argc,char **argv)

{
  char *pcVar1;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  any *paVar5;
  ostream *poVar6;
  string *psVar7;
  string usage;
  clone_impl<boost::exception_detail::error_info_injector<boost::program_options::unknown_option>_>
  e;
  positional_options_description p;
  options_description desc;
  variables_map vm;
  long *local_2b8;
  long local_2b0;
  long local_2a8 [2];
  undefined1 local_298 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_268 [32];
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_248 [32];
  options_description *local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  long *local_198;
  long local_188 [2];
  long *local_178 [2];
  long local_168 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_150 [24];
  void *local_138;
  undefined4 local_130;
  undefined8 local_128;
  undefined4 local_120;
  long local_118;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_110 [24];
  basic_parsed_options<char> local_f8;
  code *local_d0 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_c0 [8];
  _Rb_tree_node_base local_b8;
  long local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  this->_standalone = true;
  psVar7 = &this->_display_driver;
  (this->_display_driver)._M_dataplus._M_p = (pointer)&(this->_display_driver).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar7,"ncurses","");
  (this->_input_file)._M_dataplus._M_p = (pointer)&(this->_input_file).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_input_file,"");
  (this->_output_file)._M_dataplus._M_p = (pointer)&(this->_output_file).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_output_file,"");
  local_2b8 = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,"Usage: mdl [OPTIONS] <input-file>","");
  boost::program_options::options_description::options_description
            ((options_description *)local_178,(string *)&local_2b8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  local_298._0_8_ = boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (local_298,"help,h");
  ptVar2 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"display-driver,d",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"input-parser,p",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"input-file,i",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"output-file,o",(char *)ptVar2);
  boost::program_options::options_description_easy_init::operator()(pcVar1,"version");
  boost::program_options::positional_options_description::positional_options_description
            ((positional_options_description *)&local_1b0);
  boost::program_options::positional_options_description::add((char *)&local_1b0,0x1331a7);
  boost::program_options::variables_map::variables_map((variables_map *)local_d0);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_298,argc,argv);
  boost::program_options::detail::cmdline::set_options_description((options_description *)local_298)
  ;
  local_228 = (options_description *)local_178;
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)local_298);
  boost::program_options::basic_command_line_parser<char>::run
            (&local_f8,(basic_command_line_parser<char> *)local_298);
  boost::program_options::store((basic_parsed_options *)&local_f8,(variables_map *)local_d0,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&local_f8.options);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(local_248);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(local_268);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_298);
  local_298._0_8_ = &local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"help","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_c0,(key_type *)local_298);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298._0_8_ !=
      &local_288) {
    operator_delete((void *)local_298._0_8_,(ulong)(local_288._M_dataplus._M_p + 1));
  }
  if (cVar3._M_node == &local_b8) {
    local_298._0_8_ = &local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"version","");
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(local_c0,(key_type *)local_298);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298._0_8_ !=
        &local_288) {
      operator_delete((void *)local_298._0_8_,(ulong)(local_288._M_dataplus._M_p + 1));
    }
    if (cVar4._M_node == cVar3._M_node) {
      if (local_98 != 0) {
        local_298._0_8_ = &local_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"input-file","");
        cVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::find(local_c0,(key_type *)local_298);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298._0_8_ !=
            &local_288) {
          operator_delete((void *)local_298._0_8_,(ulong)(local_288._M_dataplus._M_p + 1));
        }
        if (cVar4._M_node != cVar3._M_node) {
          local_298._0_8_ = &local_288;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"input-file","");
          paVar5 = (any *)boost::program_options::abstract_variables_map::operator[]
                                    ((string *)local_d0);
          boost::any_cast<std::__cxx11::string_const&>(paVar5);
          std::__cxx11::string::_M_assign((string *)&this->_input_file);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298._0_8_
              != &local_288) {
            operator_delete((void *)local_298._0_8_,(ulong)(local_288._M_dataplus._M_p + 1));
          }
          local_298._0_8_ = &local_288;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"display-driver","");
          cVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  ::find(local_c0,(key_type *)local_298);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298._0_8_
              != &local_288) {
            operator_delete((void *)local_298._0_8_,(ulong)(local_288._M_dataplus._M_p + 1));
          }
          if (cVar4._M_node == cVar3._M_node) {
            std::__cxx11::string::_M_replace
                      ((ulong)psVar7,0,(char *)(this->_display_driver)._M_string_length,0x13300a);
          }
          else {
            local_298._0_8_ = &local_288;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"display-driver","")
            ;
            paVar5 = (any *)boost::program_options::abstract_variables_map::operator[]
                                      ((string *)local_d0);
            boost::any_cast<std::__cxx11::string_const&>(paVar5);
            std::__cxx11::string::_M_assign((string *)psVar7);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298._0_8_
                != &local_288) {
              operator_delete((void *)local_298._0_8_,(ulong)(local_288._M_dataplus._M_p + 1));
            }
          }
          local_298._0_8_ = &local_288;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"output-file","");
          cVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  ::find(local_c0,(key_type *)local_298);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298._0_8_
              != &local_288) {
            operator_delete((void *)local_298._0_8_,(ulong)(local_288._M_dataplus._M_p + 1));
          }
          if (cVar4._M_node != cVar3._M_node) {
            local_298._0_8_ = &local_288;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"output-file","");
            paVar5 = (any *)boost::program_options::abstract_variables_map::operator[]
                                      ((string *)local_d0);
            boost::any_cast<std::__cxx11::string_const&>(paVar5);
            std::__cxx11::string::_M_assign((string *)&this->_output_file);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298._0_8_
                != &local_288) {
              operator_delete((void *)local_298._0_8_,(ulong)(local_288._M_dataplus._M_p + 1));
            }
          }
          local_d0[0] = Paragraph::operator[];
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_60);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(local_90);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::~_Rb_tree(local_c0);
          if (local_198 != local_188) {
            operator_delete(local_198,local_188[0] + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1b0);
          std::
          vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
          ::~vector(local_110);
          if (local_138 != (void *)0x0) {
            operator_delete(local_138,local_118 - (long)local_138);
            local_138 = (void *)0x0;
            local_130 = 0;
            local_128 = 0;
            local_120 = 0;
            local_118 = 0;
          }
          std::
          vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
          ::~vector(local_150);
          if (local_178[0] != local_168) {
            operator_delete(local_178[0],local_168[0] + 1);
          }
          if (local_2b8 != local_2a8) {
            operator_delete(local_2b8,local_2a8[0] + 1);
          }
          return;
        }
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_2b8,local_2b0);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"mdl: Missing an input file",0x1a);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"mdl (version: ",0xe)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"1.1.3",5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  else {
    boost::program_options::operator<<((ostream *)&std::cout,(options_description *)local_178);
  }
  exit(0);
}

Assistant:

MdlOptions::MdlOptions(int argc, const char *const *argv) :
	_standalone(true),
	_display_driver("ncurses"),
	_input_file(""),
	_output_file("") {
	// Set Boost program options up
	const string usage("Usage: mdl [OPTIONS] <input-file>");
	po::options_description desc(usage);
	desc.add_options()
		("help,h", "produce help message and exit")
		("display-driver,d", po::value<string>(), "set display driver")
		("input-parser,p", po::value<string>(), "set input parser")
		("input-file,i", po::value<string>(), "input file to be used")
		("output-file,o", po::value<string>(), "output file")
		("version", "print the version information and exit");
	po::positional_options_description p;
	p.add("input-file", -1);
	po::variables_map vm;
	
	try {
		po::store(po::command_line_parser(argc, argv).options(desc).positional(p).run(), vm);
	} catch (boost::exception_detail::clone_impl<boost::exception_detail::error_info_injector<boost::program_options::unknown_option> > e) {
		cerr << "mdl: " << e.what() << endl;
		exit(1);
	}
	
	if (vm.count("help")) {
		cout << desc;
		exit(0);
	} else if (vm.count("version")) {
		cout << "mdl (version: " << MDL_VERSION_STRING << ")" << endl;
		exit(0);
	} else if (vm.empty() or vm.count("input-file") == 0) {
		cout << usage << endl;
		cout << "mdl: Missing an input file" << endl;
		exit(0);
	}

	_input_file = vm["input-file"].as<string>();
	
	if (vm.count("display-driver")) {
		_display_driver = vm["display-driver"].as<string>();
	} else {
		_display_driver = "ncurses";
	}

	if (vm.count("output-file")) {
		_output_file = vm["output-file"].as<string>();
	}
}